

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall
wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator::
visitExpression(wasm::Expression__(void *this,Expression *curr)

{
  ValidationInfo *pVVar1;
  bool bVar2;
  Function *pFVar3;
  ostream *poVar4;
  Type in_RCX;
  undefined7 uVar6;
  char *pcVar5;
  pair<std::__detail::_Node_iterator<wasm::Expression_*,_true,_false>,_bool> pVar7;
  Name name;
  Name name_00;
  bool local_412;
  bool local_411;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  uintptr_t local_3e8;
  size_t sStack_3e0;
  ostringstream local_3d0 [8];
  ostringstream ss_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  uintptr_t local_218;
  uintptr_t local_210;
  uintptr_t local_208;
  size_t sStack_200;
  ostringstream local_1e0 [8];
  ostringstream ss;
  BasicType local_64;
  uintptr_t local_60;
  uintptr_t local_58;
  bool local_49;
  BasicType local_48;
  bool validRefinement;
  Type TStack_40;
  bool validControlFlowStructureChange;
  Type newType;
  Type local_30;
  Type oldType;
  Name scope;
  Expression *curr_local;
  BinaryenIRValidator *this_local;
  
  scope.super_IString.str._M_str = (char *)curr;
  pFVar3 = Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
           getFunction((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                        *)this);
  if (pFVar3 == (Function *)0x0) {
    wasm::Name::Name((Name *)&oldType,"(global scope)");
  }
  else {
    pFVar3 = Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
             ::getFunction((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                            *)this);
    in_RCX.id = (pFVar3->super_Importable).super_Named.name.super_IString.str._M_len;
    scope.super_IString.str._M_len =
         (size_t)(pFVar3->super_Importable).super_Named.name.super_IString.str._M_str;
    oldType.id = in_RCX.id;
  }
  local_30.id = *(uintptr_t *)(scope.super_IString.str._M_str + 8);
  Visitor<wasm::ReFinalizeNode,_void>::visit
            ((Visitor<wasm::ReFinalizeNode,_void> *)((long)&newType.id + 7),
             (Expression *)scope.super_IString.str._M_str);
  TStack_40.id = *(uintptr_t *)(scope.super_IString.str._M_str + 8);
  bVar2 = wasm::Type::operator!=(&stack0xffffffffffffffc0,&local_30);
  if (bVar2) {
    bVar2 = Properties::isControlFlowStructure((Expression *)scope.super_IString.str._M_str);
    uVar6 = (undefined7)(in_RCX.id >> 8);
    local_411 = false;
    if (bVar2) {
      bVar2 = wasm::Type::isConcrete(&local_30);
      local_411 = false;
      if (bVar2) {
        local_48 = unreachable;
        local_411 = wasm::Type::operator==(&stack0xffffffffffffffc0,&local_48);
      }
    }
    validRefinement = local_411;
    local_58 = TStack_40.id;
    local_60 = local_30.id;
    bVar2 = wasm::Type::isSubType(TStack_40,local_30);
    pcVar5 = (char *)CONCAT71(uVar6,bVar2);
    local_412 = false;
    if (bVar2) {
      local_64 = unreachable;
      local_412 = wasm::Type::operator!=(&stack0xffffffffffffffc0,&local_64);
    }
    local_49 = local_412;
    if ((local_412 == false) && ((validRefinement & 1U) == 0)) {
      std::__cxx11::ostringstream::ostringstream(local_1e0);
      poVar4 = std::operator<<((ostream *)local_1e0,"stale type found in ");
      local_208 = oldType.id;
      sStack_200 = scope.super_IString.str._M_len;
      name.super_IString.str._M_str = pcVar5;
      name.super_IString.str._M_len = scope.super_IString.str._M_len;
      poVar4 = wasm::operator<<((wasm *)poVar4,(ostream *)oldType.id,name);
      poVar4 = std::operator<<(poVar4," on ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,scope.super_IString.str._M_str);
      poVar4 = std::operator<<(poVar4,"\n(marked as ");
      local_210 = local_30.id;
      poVar4 = wasm::operator<<(poVar4,local_30);
      poVar4 = std::operator<<(poVar4,", should be ");
      local_218 = TStack_40.id;
      poVar4 = wasm::operator<<(poVar4,TStack_40);
      std::operator<<(poVar4,")\n");
      pVVar1 = *(ValidationInfo **)((long)this + 0xd8);
      std::__cxx11::ostringstream::str();
      pcVar5 = scope.super_IString.str._M_str;
      pFVar3 = Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
               ::getFunction((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                              *)this);
      ValidationInfo::fail<wasm::Expression*,std::__cxx11::string>
                (pVVar1,&local_238,(Expression *)pcVar5,pFVar3);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::ostringstream::~ostringstream(local_1e0);
    }
    *(uintptr_t *)(scope.super_IString.str._M_str + 8) = local_30.id;
    in_RCX.id = local_30.id;
  }
  pVar7 = std::
          unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
          ::insert((unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
                    *)((long)this + 0xe0),(value_type *)&scope.super_IString.str._M_str);
  if (((pVar7.second ^ 0xffU) & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_3d0);
    poVar4 = std::operator<<((ostream *)local_3d0,"expression seen more than once in the tree in ");
    local_3e8 = oldType.id;
    sStack_3e0 = scope.super_IString.str._M_len;
    name_00.super_IString.str._M_str = (char *)in_RCX.id;
    name_00.super_IString.str._M_len = scope.super_IString.str._M_len;
    poVar4 = wasm::operator<<((wasm *)poVar4,(ostream *)oldType.id,name_00);
    poVar4 = std::operator<<(poVar4," on ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,scope.super_IString.str._M_str);
    std::operator<<(poVar4,'\n');
    pVVar1 = *(ValidationInfo **)((long)this + 0xd8);
    std::__cxx11::ostringstream::str();
    pcVar5 = scope.super_IString.str._M_str;
    pFVar3 = Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
             ::getFunction((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                            *)this);
    ValidationInfo::fail<wasm::Expression*,std::__cxx11::string>
              (pVVar1,&local_408,(Expression *)pcVar5,pFVar3);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::ostringstream::~ostringstream(local_3d0);
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      auto scope = getFunction() ? getFunction()->name : Name("(global scope)");
      // check if a node type is 'stale', i.e., we forgot to finalize() the
      // node.
      auto oldType = curr->type;
      ReFinalizeNode().visit(curr);
      auto newType = curr->type;
      if (newType != oldType) {
        // We accept concrete => undefined on control flow structures:
        // e.g.
        //
        //  (drop (block (result i32) (unreachable)))
        //
        // The block has a type annotated on it, which can make its unreachable
        // contents have a concrete type. Refinalize will make it unreachable,
        // so both are valid here.
        bool validControlFlowStructureChange =
          Properties::isControlFlowStructure(curr) && oldType.isConcrete() &&
          newType == Type::unreachable;
        // It's ok in general for types to get refined as long as they don't
        // become unreachable.
        bool validRefinement =
          Type::isSubType(newType, oldType) && newType != Type::unreachable;
        if (!validRefinement && !validControlFlowStructureChange) {
          std::ostringstream ss;
          ss << "stale type found in " << scope << " on " << curr
             << "\n(marked as " << oldType << ", should be " << newType
             << ")\n";
          info.fail(ss.str(), curr, getFunction());
        }
        curr->type = oldType;
      }
      // check if a node is a duplicate - expressions must not be seen more than
      // once
      if (!seen.insert(curr).second) {
        std::ostringstream ss;
        ss << "expression seen more than once in the tree in " << scope
           << " on " << curr << '\n';
        info.fail(ss.str(), curr, getFunction());
      }
    }